

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int handle_connection(int sockfd,ptls_context_t *ctx,char *server_name,char *input_file,
                     ptls_handshake_properties_t *hsprop,int request_key_update,int keep_sender_open
                     )

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  ptls_t *tls_00;
  uint64_t uVar3;
  char *pcVar4;
  int *piVar5;
  ssize_t sVar6;
  size_t delta;
  uint64_t uVar7;
  long lVar8;
  ptls_cipher_suite_t *ppVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char *local_4390;
  ptls_cipher_suite_t *cipher_suite;
  double elapsed;
  uint8_t wbuf_small [32];
  ptls_buffer_t wbuf;
  size_t max_can_be_sent;
  size_t send_amount;
  size_t leftlen;
  size_t off;
  char bytebuf [16384];
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_268 [4];
  uint __i;
  timeval timeout;
  undefined1 local_250 [4];
  int maxfd;
  fd_set exceptfds;
  fd_set writefds;
  fd_set readfds;
  uint64_t start_at;
  ssize_t ioret;
  uint64_t data_received;
  size_t early_bytes_sent;
  int local_a8;
  int ret;
  int inputfd;
  anon_enum_32 state;
  ptls_buffer_t ptbuf;
  ptls_buffer_t encbuf;
  ptls_buffer_t rbuf;
  ptls_t *tls;
  int request_key_update_local;
  ptls_handshake_properties_t *hsprop_local;
  char *input_file_local;
  char *server_name_local;
  ptls_context_t *ctx_local;
  int sockfd_local;
  
  tls_00 = ptls_new(ctx,(uint)(server_name == (char *)0x0));
  ret = 0;
  local_a8 = 0;
  early_bytes_sent._4_4_ = 0;
  data_received = 0;
  ioret = 0;
  uVar3 = (*ctx->get_time->cb)(ctx->get_time);
  ptls_buffer_init((ptls_buffer_t *)&encbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)&ptbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)&inputfd,"",0);
  fcntl(sockfd,4,0x800);
  if (input_file == "is:benchmark") {
    iVar1 = ptls_is_server(tls_00);
    if (iVar1 == 0) {
      local_a8 = -2;
    }
  }
  else if ((input_file != (char *)0x0) &&
          (local_a8 = open(input_file,0), __stream = _stderr, local_a8 == -1)) {
    piVar5 = __errno_location();
    pcVar4 = strerror(*piVar5);
    fprintf(__stream,"failed to open file:%s:%s\n",input_file,pcVar4);
    early_bytes_sent._4_4_ = 1;
    goto LAB_00107fb5;
  }
  if (server_name != (char *)0x0) {
    ptls_set_server_name(tls_00,server_name,0);
    uVar2 = ptls_handshake(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                           hsprop);
    if (uVar2 != 0x202) {
      fprintf(_stderr,"ptls_handshake:%d\n",(ulong)uVar2);
      early_bytes_sent._4_4_ = 1;
LAB_00107fb5:
      if (input_file == "is:benchmark") {
        uVar7 = (*ctx->get_time->cb)(ctx->get_time);
        lVar8 = uVar7 - uVar3;
        auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar12._0_8_ = lVar8;
        auVar12._12_4_ = 0x45300000;
        dVar11 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / 1000.0;
        ppVar9 = ptls_get_cipher(tls_00);
        lVar8 = ioret << 3;
        auVar13._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar13._0_8_ = lVar8;
        auVar13._12_4_ = 0x45300000;
        if (ppVar9 == (ptls_cipher_suite_t *)0x0) {
          local_4390 = "unknown cipher";
        }
        else {
          local_4390 = ppVar9->aead->name;
        }
        fprintf(_stderr,"received %lu bytes in %.3f seconds (%f.3Mbps); %s\n",dVar11,
                SUB84(((((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / dVar11) /
                      1000.0) / 1000.0,0),ioret,local_4390);
      }
      if (sockfd != -1) {
        close(sockfd);
      }
      if (((input_file != (char *)0x0) && (input_file != "is:benchmark")) && (-1 < local_a8)) {
        close(local_a8);
      }
      ptls_buffer_dispose((ptls_buffer_t *)&encbuf.is_allocated);
      ptls_buffer_dispose((ptls_buffer_t *)&ptbuf.is_allocated);
      ptls_buffer_dispose((ptls_buffer_t *)&inputfd);
      ptls_free(tls_00);
      return (int)(early_bytes_sent._4_4_ != 0);
    }
    early_bytes_sent._4_4_ = 0x202;
  }
  do {
    do {
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        writefds.fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
      }
      for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
        exceptfds.fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
      }
      bytebuf._16376_8_ = local_250;
      for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
        *(undefined8 *)(bytebuf._16376_8_ + (ulong)__arr_2._4_4_ * 8) = 0;
      }
      writefds.fds_bits[(long)(sockfd / 0x40) + 0xf] =
           1L << ((byte)((long)sockfd % 0x40) & 0x3f) |
           writefds.fds_bits[(long)(sockfd / 0x40) + 0xf];
      if ((encbuf.capacity != 0) || (local_a8 == -2)) {
        exceptfds.fds_bits[(long)(sockfd / 0x40) + 0xf] =
             1L << ((byte)((long)sockfd % 0x40) & 0x3f) |
             exceptfds.fds_bits[(long)(sockfd / 0x40) + 0xf];
      }
      *(ulong *)(local_250 + (long)(sockfd / 0x40) * 8) =
           1L << ((byte)((long)sockfd % 0x40) & 0x3f) |
           *(ulong *)(local_250 + (long)(sockfd / 0x40) * 8);
      timeout.tv_usec._4_4_ = sockfd + 1;
      if (-1 < local_a8) {
        writefds.fds_bits[(long)(local_a8 / 0x40) + 0xf] =
             1L << ((byte)((long)local_a8 % 0x40) & 0x3f) |
             writefds.fds_bits[(long)(local_a8 / 0x40) + 0xf];
        *(ulong *)(local_250 + (long)(local_a8 / 0x40) * 8) =
             1L << ((byte)((long)local_a8 % 0x40) & 0x3f) |
             *(ulong *)(local_250 + (long)(local_a8 / 0x40) * 8);
        if (timeout.tv_usec._4_4_ <= local_a8) {
          timeout.tv_usec._4_4_ = local_a8 + 1;
        }
      }
      iVar1 = 0xe10;
      if (encbuf.capacity != 0) {
        iVar1 = 0;
      }
      _auStack_268 = (long)iVar1;
      timeout.tv_sec = 0;
      iVar1 = select(timeout.tv_usec._4_4_,(fd_set *)(writefds.fds_bits + 0xf),
                     (fd_set *)(exceptfds.fds_bits + 0xf),(fd_set *)local_250,(timeval *)auStack_268
                    );
    } while (iVar1 == -1);
    if (((writefds.fds_bits[(long)(sockfd / 0x40) + 0xf] &
         1L << ((byte)((long)sockfd % 0x40) & 0x3f)) != 0) ||
       ((*(ulong *)(local_250 + (long)(sockfd / 0x40) * 8) &
        1L << ((byte)((long)sockfd % 0x40) & 0x3f)) != 0)) {
      leftlen = 0;
      do {
        start_at = read(sockfd,&off,0x4000);
        bVar10 = false;
        if (start_at == 0xffffffffffffffff) {
          piVar5 = __errno_location();
          bVar10 = *piVar5 == 4;
        }
      } while (bVar10);
      if ((start_at == 0xffffffffffffffff) &&
         ((piVar5 = __errno_location(), *piVar5 == 0xb ||
          (piVar5 = __errno_location(), *piVar5 == 0xb)))) {
        start_at = 0;
      }
      else if ((long)start_at < 1) goto LAB_00107fb5;
      for (; send_amount = start_at - leftlen, send_amount != 0; leftlen = send_amount + leftlen) {
        if (ret == 0) {
          early_bytes_sent._4_4_ =
               ptls_handshake(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,bytebuf + (leftlen - 8),
                              &send_amount,hsprop);
          if (early_bytes_sent._4_4_ == 0) {
            ret = 1;
            iVar1 = ptls_is_server(tls_00);
            if ((iVar1 == 0) &&
               ((hsprop->field_0).client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN
               )) {
              __assert_fail("ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/cli.c"
                            ,0x95,
                            "int handle_connection(int, ptls_context_t *, const char *, const char *, ptls_handshake_properties_t *, int, int)"
                           );
            }
            if ((hsprop->field_0).client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED) {
              shift_buffer((ptls_buffer_t *)&inputfd,data_received);
            }
            if (request_key_update != 0) {
              ptls_update_key(tls_00,1);
            }
          }
          else if (early_bytes_sent._4_4_ != 0x202) {
            if (encbuf.capacity != 0) {
              write(sockfd,(void *)ptbuf._24_8_,encbuf.capacity);
            }
            fprintf(_stderr,"ptls_handshake:%d\n",(ulong)early_bytes_sent._4_4_);
            goto LAB_00107fb5;
          }
        }
        else {
          early_bytes_sent._4_4_ =
               ptls_receive(tls_00,(ptls_buffer_t *)&encbuf.is_allocated,bytebuf + (leftlen - 8),
                            &send_amount);
          if (early_bytes_sent._4_4_ == 0) {
            if (rbuf.capacity != 0) {
              ioret = rbuf.capacity + ioret;
              if (input_file != "is:benchmark") {
                write(1,(void *)encbuf._24_8_,rbuf.capacity);
              }
              rbuf.capacity = 0;
            }
          }
          else if (early_bytes_sent._4_4_ != 0x202) {
            fprintf(_stderr,"ptls_receive:%d\n",(ulong)early_bytes_sent._4_4_);
            goto LAB_00107fb5;
          }
        }
      }
    }
    if ((encbuf.capacity == 0) || (ret == 0)) {
      if ((local_a8 < 0) ||
         (((writefds.fds_bits[(long)(local_a8 / 0x40) + 0xf] &
           1L << ((byte)((long)local_a8 % 0x40) & 0x3f)) == 0 &&
          ((*(ulong *)(local_250 + (long)(local_a8 / 0x40) * 8) &
           1L << ((byte)((long)local_a8 % 0x40) & 0x3f)) == 0)))) {
        if (local_a8 == -2) {
          if (ptbuf.base < (uint8_t *)0x4000) {
            early_bytes_sent._4_4_ =
                 ptls_buffer_reserve((ptls_buffer_t *)&inputfd,0x4000 - (long)ptbuf.base);
            if (early_bytes_sent._4_4_ != 0) goto LAB_00107fb5;
            memset(_inputfd + (long)ptbuf.base,0,0x4000 - (long)ptbuf.base);
          }
          ptbuf.capacity = 0x4000;
        }
      }
      else {
        early_bytes_sent._4_4_ = ptls_buffer_reserve((ptls_buffer_t *)&inputfd,0x4000);
        if (early_bytes_sent._4_4_ != 0) goto LAB_00107fb5;
        do {
          sVar6 = read(local_a8,_inputfd + ptbuf.capacity,0x4000);
          bVar10 = false;
          if (sVar6 == -1) {
            piVar5 = __errno_location();
            bVar10 = *piVar5 == 4;
          }
        } while (bVar10);
        if (sVar6 < 1) {
          if (sVar6 == 0) {
            if (input_file != (char *)0x0) {
              close(local_a8);
            }
            local_a8 = -1;
          }
        }
        else {
          ptbuf.capacity = sVar6 + ptbuf.capacity;
        }
      }
    }
    if (ptbuf.capacity != 0) {
      if (ret == 0) {
        max_can_be_sent = 0;
        if ((server_name != (char *)0x0) &&
           ((hsprop->field_0).client.max_early_data_size != (size_t *)0x0)) {
          wbuf._24_8_ = *(hsprop->field_0).client.max_early_data_size;
          if (ptbuf.capacity < (ulong)wbuf._24_8_) {
            wbuf._24_8_ = ptbuf.capacity;
          }
          max_can_be_sent = wbuf._24_8_ - data_received;
        }
        if (max_can_be_sent != 0) {
          early_bytes_sent._4_4_ =
               ptls_send(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,_inputfd,max_can_be_sent);
          if (early_bytes_sent._4_4_ != 0) {
            fprintf(_stderr,"ptls_send(early_data):%d\n",(ulong)early_bytes_sent._4_4_);
            goto LAB_00107fb5;
          }
          data_received = max_can_be_sent + data_received;
        }
      }
      else {
        early_bytes_sent._4_4_ =
             ptls_send(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,_inputfd,ptbuf.capacity);
        if (early_bytes_sent._4_4_ != 0) {
          fprintf(_stderr,"ptls_send(1rtt):%d\n",(ulong)early_bytes_sent._4_4_);
          goto LAB_00107fb5;
        }
        ptbuf.capacity = 0;
      }
    }
    if (encbuf.capacity != 0) {
      do {
        delta = write(sockfd,(void *)ptbuf._24_8_,encbuf.capacity);
        bVar10 = false;
        if (delta == 0xffffffffffffffff) {
          piVar5 = __errno_location();
          bVar10 = *piVar5 == 4;
        }
      } while (bVar10);
      if ((delta != 0xffffffffffffffff) ||
         ((piVar5 = __errno_location(), *piVar5 != 0xb &&
          (piVar5 = __errno_location(), *piVar5 != 0xb)))) {
        if ((long)delta < 1) goto LAB_00107fb5;
        shift_buffer((ptls_buffer_t *)&ptbuf.is_allocated,delta);
      }
    }
    if ((ret == 1) && (local_a8 == -1)) {
      if (keep_sender_open == 0) {
        ptls_buffer_init((ptls_buffer_t *)(wbuf_small + 0x18),&elapsed,0x20);
        early_bytes_sent._4_4_ =
             ptls_send_alert(tls_00,(ptls_buffer_t *)(wbuf_small + 0x18),'\x01','\0');
        if (early_bytes_sent._4_4_ != 0) {
          fprintf(_stderr,"ptls_send_alert:%d\n",(ulong)early_bytes_sent._4_4_);
        }
        if (wbuf.capacity != 0) {
          write(sockfd,(void *)wbuf_small._24_8_,wbuf.capacity);
        }
        ptls_buffer_dispose((ptls_buffer_t *)(wbuf_small + 0x18));
        shutdown(sockfd,1);
      }
      ret = 2;
    }
  } while( true );
}

Assistant:

static int handle_connection(int sockfd, ptls_context_t *ctx, const char *server_name, const char *input_file,
                             ptls_handshake_properties_t *hsprop, int request_key_update, int keep_sender_open)
{
    static const int inputfd_is_benchmark = -2;

    ptls_t *tls = ptls_new(ctx, server_name == NULL);
    ptls_buffer_t rbuf, encbuf, ptbuf;
    enum { IN_HANDSHAKE, IN_1RTT, IN_SHUTDOWN } state = IN_HANDSHAKE;
    int inputfd = 0, ret = 0;
    size_t early_bytes_sent = 0;
    uint64_t data_received = 0;
    ssize_t ioret;

    uint64_t start_at = ctx->get_time->cb(ctx->get_time);

    ptls_buffer_init(&rbuf, "", 0);
    ptls_buffer_init(&encbuf, "", 0);
    ptls_buffer_init(&ptbuf, "", 0);

    fcntl(sockfd, F_SETFL, O_NONBLOCK);

    if (input_file == input_file_is_benchmark) {
        if (!ptls_is_server(tls))
            inputfd = inputfd_is_benchmark;
    } else if (input_file != NULL) {
        if ((inputfd = open(input_file, O_RDONLY)) == -1) {
            fprintf(stderr, "failed to open file:%s:%s\n", input_file, strerror(errno));
            ret = 1;
            goto Exit;
        }
    }
    if (server_name != NULL) {
        ptls_set_server_name(tls, server_name, 0);
        if ((ret = ptls_handshake(tls, &encbuf, NULL, NULL, hsprop)) != PTLS_ERROR_IN_PROGRESS) {
            fprintf(stderr, "ptls_handshake:%d\n", ret);
            ret = 1;
            goto Exit;
        }
    }

    while (1) {
        /* check if data is available */
        fd_set readfds, writefds, exceptfds;
        int maxfd = 0;
        struct timeval timeout;
        do {
            FD_ZERO(&readfds);
            FD_ZERO(&writefds);
            FD_ZERO(&exceptfds);
            FD_SET(sockfd, &readfds);
            if (encbuf.off != 0 || inputfd == inputfd_is_benchmark)
                FD_SET(sockfd, &writefds);
            FD_SET(sockfd, &exceptfds);
            maxfd = sockfd + 1;
            if (inputfd >= 0) {
                FD_SET(inputfd, &readfds);
                FD_SET(inputfd, &exceptfds);
                if (maxfd <= inputfd)
                    maxfd = inputfd + 1;
            }
            timeout.tv_sec = encbuf.off != 0 ? 0 : 3600;
            timeout.tv_usec = 0;
        } while (select(maxfd, &readfds, &writefds, &exceptfds, &timeout) == -1);

        /* consume incoming messages */
        if (FD_ISSET(sockfd, &readfds) || FD_ISSET(sockfd, &exceptfds)) {
            char bytebuf[16384];
            size_t off = 0, leftlen;
            while ((ioret = read(sockfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
                ioret = 0;
            } else if (ioret <= 0) {
                goto Exit;
            }
            while ((leftlen = ioret - off) != 0) {
                if (state == IN_HANDSHAKE) {
                    if ((ret = ptls_handshake(tls, &encbuf, bytebuf + off, &leftlen, hsprop)) == 0) {
                        state = IN_1RTT;
                        assert(ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
                        /* release data sent as early-data, if server accepted it */
                        if (hsprop->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED)
                            shift_buffer(&ptbuf, early_bytes_sent);
                        if (request_key_update)
                            ptls_update_key(tls, 1);
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        if (encbuf.off != 0)
                            (void)write(sockfd, encbuf.base, encbuf.off);
                        fprintf(stderr, "ptls_handshake:%d\n", ret);
                        goto Exit;
                    }
                } else {
                    if ((ret = ptls_receive(tls, &rbuf, bytebuf + off, &leftlen)) == 0) {
                        if (rbuf.off != 0) {
                            data_received += rbuf.off;
                            if (input_file != input_file_is_benchmark)
                                write(1, rbuf.base, rbuf.off);
                            rbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        fprintf(stderr, "ptls_receive:%d\n", ret);
                        goto Exit;
                    }
                }
                off += leftlen;
            }
        }

        /* encrypt data to send, if any is available */
        if (encbuf.off == 0 || state == IN_HANDSHAKE) {
            static const size_t block_size = 16384;
            if (inputfd >= 0 && (FD_ISSET(inputfd, &readfds) || FD_ISSET(inputfd, &exceptfds))) {
                if ((ret = ptls_buffer_reserve(&ptbuf, block_size)) != 0)
                    goto Exit;
                while ((ioret = read(inputfd, ptbuf.base + ptbuf.off, block_size)) == -1 && errno == EINTR)
                    ;
                if (ioret > 0) {
                    ptbuf.off += ioret;
                } else if (ioret == 0) {
                    /* closed */
                    if (input_file != NULL)
                        close(inputfd);
                    inputfd = -1;
                }
            } else if (inputfd == inputfd_is_benchmark) {
                if (ptbuf.capacity < block_size) {
                    if ((ret = ptls_buffer_reserve(&ptbuf, block_size - ptbuf.capacity)) != 0)
                        goto Exit;
                    memset(ptbuf.base + ptbuf.capacity, 0, block_size - ptbuf.capacity);
                }
                ptbuf.off = block_size;
            }
        }
        if (ptbuf.off != 0) {
            if (state == IN_HANDSHAKE) {
                size_t send_amount = 0;
                if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
                    size_t max_can_be_sent = *hsprop->client.max_early_data_size;
                    if (max_can_be_sent > ptbuf.off)
                        max_can_be_sent = ptbuf.off;
                    send_amount = max_can_be_sent - early_bytes_sent;
                }
                if (send_amount != 0) {
                    if ((ret = ptls_send(tls, &encbuf, ptbuf.base, send_amount)) != 0) {
                        fprintf(stderr, "ptls_send(early_data):%d\n", ret);
                        goto Exit;
                    }
                    early_bytes_sent += send_amount;
                }
            } else {
                if ((ret = ptls_send(tls, &encbuf, ptbuf.base, ptbuf.off)) != 0) {
                    fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                    goto Exit;
                }
                ptbuf.off = 0;
            }
        }

        /* send any data */
        if (encbuf.off != 0) {
            while ((ioret = write(sockfd, encbuf.base, encbuf.off)) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
            } else if (ioret <= 0) {
                goto Exit;
            } else {
                shift_buffer(&encbuf, ioret);
            }
        }

        /* close the sender side when necessary */
        if (state == IN_1RTT && inputfd == -1) {
            if (!keep_sender_open) {
                ptls_buffer_t wbuf;
                uint8_t wbuf_small[32];
                ptls_buffer_init(&wbuf, wbuf_small, sizeof(wbuf_small));
                if ((ret = ptls_send_alert(tls, &wbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_CLOSE_NOTIFY)) != 0) {
                    fprintf(stderr, "ptls_send_alert:%d\n", ret);
                }
                if (wbuf.off != 0)
                    (void)write(sockfd, wbuf.base, wbuf.off);
                ptls_buffer_dispose(&wbuf);
                shutdown(sockfd, SHUT_WR);
            }
            state = IN_SHUTDOWN;
        }
    }

Exit:
    if (input_file == input_file_is_benchmark) {
        double elapsed = (ctx->get_time->cb(ctx->get_time) - start_at) / 1000.0;
        ptls_cipher_suite_t *cipher_suite = ptls_get_cipher(tls);
        fprintf(stderr, "received %" PRIu64 " bytes in %.3f seconds (%f.3Mbps); %s\n", data_received, elapsed,
                data_received * 8 / elapsed / 1000 / 1000, cipher_suite != NULL ? cipher_suite->aead->name : "unknown cipher");
    }

    if (sockfd != -1)
        close(sockfd);
    if (input_file != NULL && input_file != input_file_is_benchmark && inputfd >= 0)
        close(inputfd);
    ptls_buffer_dispose(&rbuf);
    ptls_buffer_dispose(&encbuf);
    ptls_buffer_dispose(&ptbuf);
    ptls_free(tls);

    return ret != 0;
}